

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O3

void __thiscall
IR::MultiBranchInstr::MapMultiBrLabels<IR::Instr::Dump(IRDumpFlags)::__1>(MultiBranchInstr *this)

{
  Kind KVar1;
  long *plVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  BranchDictionary *branchDictionary;
  long *plVar8;
  
  plVar2 = (long *)this->m_branchTargets;
  if (plVar2 == (long *)0x0) {
    return;
  }
  KVar1 = this->m_kind;
  if ((KVar1 == IntJumpTable) || (KVar1 == SingleCharStrJumpTable)) {
    plVar8 = plVar2 + 1;
    lVar5 = this->m_baseCaseValue;
    if (lVar5 <= this->m_lastCaseValue) {
      lVar3 = *plVar2;
      do {
        Output::Print(L"$L%d ",(ulong)*(uint *)(*(long *)(lVar3 + this->m_baseCaseValue * -8 +
                                                         lVar5 * 8) + 0x7c));
        lVar5 = lVar5 + 1;
      } while (lVar5 <= this->m_lastCaseValue);
    }
  }
  else {
    if (KVar1 != StrDictionary) {
      MapMultiBrLabels<IR::Instr::Dump(IRDumpFlags)::__1>();
      return;
    }
    plVar8 = plVar2 + 7;
    uVar4 = *(uint *)((long)plVar2 + 0x1c);
    if (uVar4 != 0) {
      uVar6 = 0;
      do {
        iVar7 = *(int *)(*plVar2 + uVar6 * 4);
        if (iVar7 != -1) {
          do {
            lVar5 = (long)iVar7;
            iVar7 = *(int *)(plVar2[1] + 8 + lVar5 * 0x18);
            Output::Print(L"$L%d ",(ulong)*(uint *)(*(long *)(plVar2[1] + lVar5 * 0x18) + 0x7c));
          } while (iVar7 != -1);
          uVar4 = *(uint *)((long)plVar2 + 0x1c);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar4);
    }
  }
  Output::Print(L"$L%d ",(ulong)*(uint *)(*plVar8 + 0x7c));
  return;
}

Assistant:

void MapMultiBrLabels(Fn fn)
    {
        MapMultiBrTargetByAddress([fn](void ** value) -> void
        {
            fn((LabelInstr*) *value);
        });
    }